

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O1

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,void **vtt,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  int *piVar1;
  QFunctionJAOHInterface QVar2;
  sp_counted_base *psVar3;
  QMDP *this_00;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38;
  
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,vtt + 1,puf);
  QVar2 = (QFunctionJAOHInterface)*vtt;
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = QVar2;
  *(void **)(&(this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
              super_QFunctionJAOHInterface.field_0x0 + *(long *)((long)QVar2 + -0x80)) = vtt[0x10];
  *(void **)(&(this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
              super_QFunctionJAOHInterface.field_0x0 +
            *(long *)((long)(this->super_FactoredQLastTimeStepOrElse).
                            super_FactoredQFunctionStateJAOHInterface.super_QFunctionJAOHInterface +
                     -0x60)) = vtt[0x11];
  *(void **)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       vtt[0x12];
  *(void **)(&(this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
              super_QFunctionJAOHInterface.field_0x0 +
            *(long *)((long)(this->super_FactoredQLastTimeStepOrElse).
                            super_FactoredQFunctionStateJAOHInterface.super_QFunctionJAOHInterface +
                     -0x88)) = vtt[0x13];
  this_00 = (QMDP *)operator_new(0x70);
  psVar3 = (puf->pn).pi_;
  local_38.px = &puf->px->super_PlanningUnitDecPOMDPDiscrete;
  local_38.pn.pi_ = (puf->pn).pi_;
  if (psVar3 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar3->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QMDP::QMDP(this_00,&local_38,false);
  this->_m_QMDP = this_00;
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}